

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sDrawTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Stress::anon_unknown_0::InvalidDrawCase::iterate(InvalidDrawCase *this)

{
  pointer *ppuVar1;
  InvalidOperation IVar2;
  RenderContext *renderCtx;
  int iVar3;
  GLuint index;
  GLuint index_00;
  GLenum GVar4;
  undefined4 extraout_var;
  ProgramSources *pPVar5;
  deUint32 dVar6;
  GLsizeiptr size;
  size_type __n;
  long lVar7;
  unsigned_short uVar8;
  CallLogWrapper gl;
  allocator<char> local_316;
  allocator<char> local_315;
  GLuint local_314;
  DrawArraysCommand drawCommand;
  string local_2e8;
  string local_2c8;
  undefined1 local_2a8 [40];
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  ShaderProgram program;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&indices,0,0xac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,
             "#version 310 es\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,&local_315);
  glu::VertexSource::VertexSource((VertexSource *)&drawCommand,&local_2c8);
  pPVar5 = glu::ProgramSources::operator<<((ProgramSources *)&indices,(ShaderSource *)&drawCommand);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,
             "#version 310 es\nlayout(location = 0) out highp vec4 fragColor;\nin highp vec4 v_color;\nvoid main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,&local_316);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2a8,&local_2e8);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_2a8);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar5);
  std::__cxx11::string::~string((string *)(local_2a8 + 8));
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&drawCommand.first);
  std::__cxx11::string::~string((string *)&local_2c8);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&indices);
  index = glu::CallLogWrapper::glGetAttribLocation(&gl,program.m_program.m_program,"a_position");
  local_314 = program.m_program.m_program;
  index_00 = glu::CallLogWrapper::glGetAttribLocation(&gl,program.m_program.m_program,"a_color");
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGenVertexArrays(&gl,1,&this->m_vao);
  glu::CallLogWrapper::glBindVertexArray(&gl,this->m_vao);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar4,"gen vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                  ,0xbf);
  if (this->m_drawType == DRAW_ELEMENTS) {
    __n = 10000;
    if (this->m_op == INVALID_INDEX_COUNT) {
      __n = 10;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&indices,__n,(allocator_type *)&drawCommand);
    IVar2 = this->m_op;
    for (lVar7 = 0;
        lVar7 < (int)((ulong)(CONCAT44(indices.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       (int)indices.
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl.super__Vector_impl_data._M_finish) -
                             (long)indices.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 1);
        lVar7 = lVar7 + 1) {
      uVar8 = (unsigned_short)lVar7 + 10000;
      if (IVar2 != INVALID_INDEX) {
        uVar8 = (unsigned_short)lVar7;
      }
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = uVar8;
    }
    glu::CallLogWrapper::glGenBuffers(&gl,1,&this->m_indexBufferID);
    glu::CallLogWrapper::glBindBuffer(&gl,0x8893,this->m_indexBufferID);
    glu::CallLogWrapper::glBufferData
              (&gl,0x8893,
               (long)((int)indices.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (int)indices.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffe,
               indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    GVar4 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar4,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                    ,0xcd);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  }
  IVar2 = this->m_op;
  glu::CallLogWrapper::glGenBuffers(&gl,1,&this->m_dataBufferID);
  glu::CallLogWrapper::glBindBuffer(&gl,0x8892,this->m_dataBufferID);
  size = 160000;
  if (IVar2 == INVALID_DATA_COUNT) {
    size = 0xa0;
  }
  glu::CallLogWrapper::glBufferData(&gl,0x8892,size,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glVertexAttribPointer(&gl,index,4,0x1406,'\0',0,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(&gl,index);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar4,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                  ,0xda);
  glu::CallLogWrapper::glGenBuffers(&gl,1,&this->m_colorBufferID);
  glu::CallLogWrapper::glBindBuffer(&gl,0x8892,this->m_colorBufferID);
  glu::CallLogWrapper::glBufferData(&gl,0x8892,0x10,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glVertexAttribPointer(&gl,index_00,4,0x1406,'\0',0,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(&gl,index_00);
  dVar6 = 1;
  glu::CallLogWrapper::glVertexAttribDivisor(&gl,index_00,1);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar4,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                  ,0xe7);
  if (this->m_drawType == DRAW_ELEMENTS) {
    drawCommand.count = 10000;
    IVar2 = this->m_op;
    drawCommand.primCount = 1;
    if (IVar2 == INVALID_DATA_INSTANCED) {
      drawCommand.primCount = 1000;
    }
    drawCommand.first = 0;
    if (IVar2 == INVALID_INDEX_FIRST) {
      drawCommand.first = 10000;
    }
    dVar6 = 0;
    if (IVar2 == INVALID_DATA_FIRST) {
      dVar6 = 10000;
    }
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppuVar1 = &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
    drawCommand.reservedMustBeZero = dVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"drawCommand:");
    std::operator<<((ostream *)ppuVar1,"\n\tcount:\t");
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"\n\tprimCount\t");
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"\n\tfirstIndex\t");
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"\n\tbaseVertex\t");
    std::ostream::operator<<(ppuVar1,dVar6);
    std::operator<<((ostream *)ppuVar1,"\n\treservedMustBeZero\t");
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&indices,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
    glu::CallLogWrapper::glGenBuffers(&gl,1,&this->m_cmdBufferID);
    glu::CallLogWrapper::glBindBuffer(&gl,0x8f3f,this->m_cmdBufferID);
    glu::CallLogWrapper::glBufferData(&gl,0x8f3f,0x14,&drawCommand,0x88e4);
    GVar4 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar4,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                    ,0x117);
  }
  else if (this->m_drawType == DRAW_ARRAYS) {
    drawCommand.count = 10000;
    IVar2 = this->m_op;
    if (IVar2 == INVALID_DATA_INSTANCED) {
      dVar6 = 1000;
    }
    drawCommand.first = 0;
    if (IVar2 == INVALID_DATA_FIRST) {
      drawCommand.first = 10000;
    }
    drawCommand.reservedMustBeZero = (uint)(IVar2 == INVALID_RESERVED) * 5;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppuVar1 = &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
    drawCommand.primCount = dVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"drawCommand:");
    std::operator<<((ostream *)ppuVar1,"\n\tcount:\t");
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"\n\tprimCount\t");
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"\n\tfirst\t");
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"\n\treservedMustBeZero\t");
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&indices,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
    glu::CallLogWrapper::glGenBuffers(&gl,1,&this->m_cmdBufferID);
    glu::CallLogWrapper::glBindBuffer(&gl,0x8f3f,this->m_cmdBufferID);
    glu::CallLogWrapper::glBufferData(&gl,0x8f3f,0x10,&drawCommand,0x88e4);
    GVar4 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar4,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                    ,0xff);
  }
  glu::CallLogWrapper::glViewport(&gl,0,0,1,1);
  glu::CallLogWrapper::glUseProgram(&gl,local_314);
  if (this->m_drawType == DRAW_ARRAYS) {
    glu::CallLogWrapper::glDrawArraysIndirect(&gl,4,(void *)0x0);
  }
  else if (this->m_drawType == DRAW_ELEMENTS) {
    glu::CallLogWrapper::glDrawElementsIndirect(&gl,4,0x1403,(void *)0x0);
  }
  glu::CallLogWrapper::glUseProgram(&gl,0);
  glu::CallLogWrapper::glFinish(&gl);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ShaderProgram::~ShaderProgram(&program);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

InvalidDrawCase::IterateResult InvalidDrawCase::iterate (void)
{
	const int drawCount				= 10;		//!< number of elements safe to draw (all buffers have this)
	const int overBoundDrawCount	= 10000;	//!< number of elements in all other buffers than our target buffer
	const int drawInstances			= 1;
	const int overBoundInstances	= 1000;

	glu::CallLogWrapper gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_colorVertexShaderSource) << glu::FragmentSource(s_colorFragmentShaderSource));
	const deUint32		programID		= program.getProgram();
	const deInt32		posLocation		= gl.glGetAttribLocation(programID, "a_position");
	const deInt32		colorLocation	= gl.glGetAttribLocation(programID, "a_color");

	gl.enableLogging(true);

	gl.glGenVertexArrays(1, &m_vao);
	gl.glBindVertexArray(m_vao);
	glu::checkError(gl.glGetError(), "gen vao", __FILE__, __LINE__);

	// indices
	if (m_drawType == DRAW_ELEMENTS)
	{
		const int				indexBufferSize = (m_op == INVALID_INDEX_COUNT) ? (drawCount) : (overBoundDrawCount);
		std::vector<deUint16>	indices			(indexBufferSize);

		for (int ndx = 0; ndx < (int)indices.size(); ++ndx)
			indices[ndx] = (deUint16)((m_op == INVALID_INDEX) ? (overBoundDrawCount + ndx) : (ndx));

		gl.glGenBuffers(1, &m_indexBufferID);
		gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBufferID);
		gl.glBufferData(GL_ELEMENT_ARRAY_BUFFER, (int)(indices.size() * sizeof(deUint16)), &indices[0], GL_STATIC_DRAW);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}

	// data
	{
		const int dataSize = (m_op == INVALID_DATA_COUNT) ? (drawCount) : (overBoundDrawCount);

		// any data is ok
		gl.glGenBuffers(1, &m_dataBufferID);
		gl.glBindBuffer(GL_ARRAY_BUFFER, m_dataBufferID);
		gl.glBufferData(GL_ARRAY_BUFFER, dataSize * sizeof(float[4]), DE_NULL, GL_STATIC_DRAW);
		gl.glVertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.glEnableVertexAttribArray(posLocation);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}

	// potentially instanced data
	{
		const int dataSize = drawInstances;

		gl.glGenBuffers(1, &m_colorBufferID);
		gl.glBindBuffer(GL_ARRAY_BUFFER, m_colorBufferID);
		gl.glBufferData(GL_ARRAY_BUFFER, dataSize * sizeof(float[4]), DE_NULL, GL_STATIC_DRAW);
		gl.glVertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.glEnableVertexAttribArray(colorLocation);
		gl.glVertexAttribDivisor(colorLocation, 1);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}

	// command
	if (m_drawType == DRAW_ARRAYS)
	{
		DrawArraysCommand drawCommand;
		drawCommand.count				= overBoundDrawCount;
		drawCommand.primCount			= (m_op == INVALID_DATA_INSTANCED)	? (overBoundInstances)	: (drawInstances);
		drawCommand.first				= (m_op == INVALID_DATA_FIRST)		? (overBoundDrawCount)	: (0);
		drawCommand.reservedMustBeZero	= (m_op == INVALID_RESERVED)		? (5)					: (0);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "drawCommand:"
			<< "\n\tcount:\t" << drawCommand.count
			<< "\n\tprimCount\t" << drawCommand.primCount
			<< "\n\tfirst\t" << drawCommand.first
			<< "\n\treservedMustBeZero\t" << drawCommand.reservedMustBeZero
			<< tcu::TestLog::EndMessage;

		gl.glGenBuffers(1, &m_cmdBufferID);
		gl.glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_cmdBufferID);
		gl.glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(drawCommand), &drawCommand, GL_STATIC_DRAW);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}
	else if (m_drawType == DRAW_ELEMENTS)
	{
		DrawElementsCommand drawCommand;
		drawCommand.count				= overBoundDrawCount;
		drawCommand.primCount			= (m_op == INVALID_DATA_INSTANCED)	? (overBoundInstances)	: (drawInstances);
		drawCommand.firstIndex			= (m_op == INVALID_INDEX_FIRST)		? (overBoundDrawCount)	: (0);
		drawCommand.baseVertex			= (m_op == INVALID_DATA_FIRST)		? (overBoundDrawCount)	: (0);
		drawCommand.reservedMustBeZero	= (m_op == INVALID_RESERVED)		? (5)					: (0);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "drawCommand:"
			<< "\n\tcount:\t" << drawCommand.count
			<< "\n\tprimCount\t" << drawCommand.primCount
			<< "\n\tfirstIndex\t" << drawCommand.firstIndex
			<< "\n\tbaseVertex\t" << drawCommand.baseVertex
			<< "\n\treservedMustBeZero\t" << drawCommand.reservedMustBeZero
			<< tcu::TestLog::EndMessage;

		gl.glGenBuffers(1, &m_cmdBufferID);
		gl.glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_cmdBufferID);
		gl.glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(drawCommand), &drawCommand, GL_STATIC_DRAW);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}
	else
		DE_ASSERT(DE_FALSE);

	gl.glViewport(0, 0, 1, 1);
	gl.glUseProgram(programID);

	if (m_drawType == DRAW_ELEMENTS)
		gl.glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_SHORT, DE_NULL);
	else if (m_drawType == DRAW_ARRAYS)
		gl.glDrawArraysIndirect(GL_TRIANGLES, DE_NULL);
	else
		DE_ASSERT(DE_FALSE);

	gl.glUseProgram(0);
	gl.glFinish();

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}